

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# propagate_order.cpp
# Opt level: O3

unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>,_true> __thiscall
duckdb::StatisticsPropagator::PropagateStatistics
          (StatisticsPropagator *this,LogicalOrder *order,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *node_ptr)

{
  pointer pLVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var3;
  Optimizer *pOVar4;
  Optimizer *in_RAX;
  pointer *__ptr;
  BoundOrderByNode *bound_order;
  Optimizer *local_38;
  
  local_38 = in_RAX;
  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
  ::operator[]((vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                *)(node_ptr + 2),0);
  PropagateStatistics((StatisticsPropagator *)&stack0xffffffffffffffc8,
                      (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       *)order);
  pOVar4 = local_38;
  local_38 = (Optimizer *)0x0;
  pLVar1 = (order->super_LogicalOperator).types.
           super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
           super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  (order->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)pOVar4;
  if ((pLVar1 != (pointer)0x0) && (operator_delete(pLVar1), local_38 != (Optimizer *)0x0)) {
    operator_delete(local_38);
  }
  _Var3._M_head_impl =
       node_ptr[0xe].
       super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
       .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
  for (_Var2._M_head_impl =
            node_ptr[0xd].
            super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
            ._M_t.
            super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
            .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl;
      _Var2._M_head_impl != _Var3._M_head_impl;
      _Var2._M_head_impl =
           (LogicalOperator *)
           ((long)&((_Var2._M_head_impl)->children).
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
           + 8)) {
    PropagateExpression((StatisticsPropagator *)&stack0xffffffffffffffc8,
                        (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                         *)order);
    pOVar4 = local_38;
    local_38 = (Optimizer *)0x0;
    ::std::__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_>::
    reset((__uniq_ptr_impl<duckdb::BaseStatistics,_std::default_delete<duckdb::BaseStatistics>_> *)
          &(_Var2._M_head_impl)->children,(pointer)pOVar4);
    pOVar4 = local_38;
    if (local_38 != (Optimizer *)0x0) {
      BaseStatistics::~BaseStatistics((BaseStatistics *)local_38);
      operator_delete(pOVar4);
    }
  }
  this->optimizer =
       (Optimizer *)
       (order->super_LogicalOperator).types.
       super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (order->super_LogicalOperator).types.
  super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  return (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)
         (unique_ptr<duckdb::NodeStatistics,_std::default_delete<duckdb::NodeStatistics>_>)this;
}

Assistant:

unique_ptr<NodeStatistics> StatisticsPropagator::PropagateStatistics(LogicalOrder &order,
                                                                     unique_ptr<LogicalOperator> &node_ptr) {
	// first propagate to the child
	node_stats = PropagateStatistics(order.children[0]);

	// then propagate to each of the order expressions
	for (auto &bound_order : order.orders) {
		bound_order.stats = PropagateExpression(bound_order.expression);
	}
	return std::move(node_stats);
}